

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O0

void __thiscall BloomFilter::BloomFilter(BloomFilter *this,ifstream *in)

{
  int iVar1;
  byte bVar2;
  undefined1 local_2850 [24];
  int i;
  char c;
  char *__end1;
  char *__begin1;
  char (*__range1) [10240];
  char local_2818 [4];
  int p;
  char buffer [10240];
  ifstream *in_local;
  BloomFilter *this_local;
  
  buffer._10232_8_ = in;
  std::bitset<81920UL>::bitset(&this->bits);
  std::istream::seekg(buffer._10232_8_,0x20);
  std::istream::read((char *)buffer._10232_8_,(long)local_2818);
  __range1._4_4_ = 0;
  _i = buffer + 0x27f8;
  __end1 = local_2818;
  __begin1 = __end1;
  for (; __end1 != _i; __end1 = __end1 + 1) {
    local_2850[0x17] = *__end1;
    for (local_2850._16_4_ = 0; (int)local_2850._16_4_ < 8;
        local_2850._16_4_ = local_2850._16_4_ + 1) {
      iVar1 = (int)local_2850[0x17];
      bVar2 = (byte)local_2850._16_4_;
      __range1._4_4_ = __range1._4_4_ + 1;
      std::bitset<81920UL>::operator[]((bitset<81920UL> *)local_2850,(size_t)this);
      std::bitset<81920UL>::reference::operator=
                ((reference *)local_2850,(iVar1 >> (bVar2 & 0x1f) & 1U) != 0);
      std::bitset<81920UL>::reference::~reference((reference *)local_2850);
    }
  }
  return;
}

Assistant:

BloomFilter::BloomFilter(ifstream &in) {
  in.seekg(32, ifstream::beg);
  char buffer[10240];
  in.read(buffer, 10240);
  int p = 0;
  for (char c : buffer) {
    for (int i = 0; i < 8; i++) bits[p++] = (c >> i) & 1;
  }
}